

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O1

bool __thiscall FMugShot::SetState(FMugShot *this,char *state_name,bool wait_till_done,bool reset)

{
  FMugShotState *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  FMugShotState *pFVar7;
  
  iVar3 = FName::NameManager::FindName(&FName::NameData,state_name,true);
  pFVar7 = MugShotStates.Array;
  for (uVar6 = (ulong)MugShotStates.Count; uVar6 != 0; uVar6 = uVar6 - 1) {
    if ((pFVar7->State).Index == iVar3) goto LAB_00601a93;
    pFVar7 = pFVar7 + 1;
  }
  pFVar7 = (FMugShotState *)0x0;
LAB_00601a93:
  if (pFVar7 == (FMugShotState *)0x0) {
    pcVar5 = strchr(state_name,0x2e);
    if (pcVar5 != (char *)0x0) {
      iVar3 = FName::NameManager::FindName
                        (&FName::NameData,state_name,(long)pcVar5 - (long)state_name,true);
      pFVar7 = MugShotStates.Array;
      for (uVar6 = (ulong)MugShotStates.Count; uVar6 != 0; uVar6 = uVar6 - 1) {
        if ((pFVar7->State).Index == iVar3) goto LAB_00601ae9;
        pFVar7 = pFVar7 + 1;
      }
    }
    pFVar7 = (FMugShotState *)0x0;
LAB_00601ae9:
    if (pFVar7 != (FMugShotState *)0x0) goto LAB_00601aee;
LAB_00601b10:
    bVar2 = false;
  }
  else {
LAB_00601aee:
    this->bNormal = false;
    this->bOuchActive = false;
    pFVar1 = this->CurrentState;
    if (pFVar7 == pFVar1) {
      if (!reset) {
        return true;
      }
    }
    else {
      if ((wait_till_done && pFVar1 != (FMugShotState *)0x0) &&
         ((undefined1  [40])((undefined1  [40])*pFVar1 & (undefined1  [40])0x10) ==
          (undefined1  [40])0x0)) goto LAB_00601b10;
      this->CurrentState = pFVar7;
    }
    pFVar7->Time = ((pFVar7->Frames).Array)->Delay;
    pFVar7->Position = 0;
    *(byte *)pFVar7 = *(byte *)pFVar7 & 0xef;
    uVar4 = FRandom::GenRand32(&M_Random);
    pFVar7->Random = uVar4 & 0xff;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool FMugShot::SetState(const char *state_name, bool wait_till_done, bool reset)
{
	// Search for full name.
	FMugShotState *state = FindMugShotState(FName(state_name, true));
	if (state == NULL)
	{
		// Search for initial name, if the full one contains a dot.
		const char *dot = strchr(state_name, '.');
		if (dot != NULL)
		{
			state = FindMugShotState(FName(state_name, dot - state_name, true));
		}
		if (state == NULL)
		{
			// Requested state does not exist, so do nothing.
			return false;
		}
	}
	bNormal = false; //Assume we are not setting god or normal for now.
	bOuchActive = false;
	if (state != CurrentState)
	{
		if (!wait_till_done || CurrentState == NULL || CurrentState->bFinished)
		{
			CurrentState = state;
			state->Reset();
			return true;
		}
		return false;
	}
	else if(reset)
	{
		state->Reset();
		return true;
	}
	return true;
}